

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_atomic_func_op
          (CompilerMSL *this,uint32_t result_type,uint32_t result_id,char *op,Op opcode,
          uint32_t mem_order_1,uint32_t mem_order_2,bool has_mem_order_2,uint32_t obj,uint32_t op1,
          bool op1_is_pointer,bool op1_is_literal,uint32_t op2)

{
  uint32_t arg;
  bool bVar1;
  uint32_t id;
  char *__s1;
  BaseType BVar2;
  int iVar3;
  SPIRType *pSVar4;
  SPIRVariable *argument;
  SPIRType *pSVar5;
  CompilerError *pCVar6;
  uint *ts_1;
  string *this_00;
  bool bVar7;
  char (*in_stack_fffffffffffffde8) [2];
  string local_210;
  string exp;
  string local_1d0;
  BaseType local_1b0;
  uint32_t local_1ac;
  char *local_1a8;
  string local_1a0;
  SPIRType remapped_type;
  
  local_1a8 = op;
  ::std::__cxx11::string::string((string *)&remapped_type,op,(allocator *)&local_210);
  local_1ac = result_type;
  ::std::operator+(&exp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &remapped_type,"(");
  ::std::__cxx11::string::~string((string *)&remapped_type);
  pSVar4 = Compiler::expression_type((Compiler *)this,obj);
  pSVar4 = Compiler::get_pointee_type((Compiler *)this,pSVar4);
  if ((opcode & ~OpSourceContinued) == OpAtomicUMin) {
    BVar2 = to_unsigned_basetype(pSVar4->width);
  }
  else if ((opcode & ~OpSourceContinued) == OpAtomicSMin) {
    BVar2 = to_signed_basetype(pSVar4->width);
  }
  else {
    BVar2 = *(BaseType *)&(pSVar4->super_IVariant).field_0xc;
  }
  if (pSVar4->width == 0x40) {
    pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&remapped_type,"MSL currently does not support 64-bit atomics.",
               (allocator *)&local_210);
    CompilerError::CompilerError(pCVar6,(string *)&remapped_type);
    __cxa_throw(pCVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  SPIRType::SPIRType(&remapped_type,pSVar4);
  remapped_type.super_IVariant._12_4_ = BVar2;
  ::std::__cxx11::string::append((char *)&exp);
  argument = Compiler::maybe_get_backing_variable((Compiler *)this,obj);
  if (argument == (SPIRVariable *)0x0) {
    pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_210,"No backing variable for atomic operation.",
               (allocator *)&local_1d0);
    CompilerError::CompilerError(pCVar6,&local_210);
    __cxa_throw(pCVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  pSVar5 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(argument->super_IVariant).field_0xc);
  if ((pSVar5->storage == StorageClassUniformConstant) &&
     (*(int *)&(pSVar5->super_IVariant).field_0xc == 0x10)) {
    ::std::__cxx11::string::append((char *)&exp);
  }
  else {
    get_argument_address_space_abi_cxx11_(&local_210,this,argument);
    ::std::__cxx11::string::append((string *)&exp);
    ::std::__cxx11::string::~string((string *)&local_210);
  }
  ::std::__cxx11::string::append((char *)&exp);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (&local_210,this,&remapped_type,0);
  ::std::__cxx11::string::append((string *)&exp);
  ::std::__cxx11::string::~string((string *)&local_210);
  ::std::__cxx11::string::append((char *)&exp);
  ::std::__cxx11::string::append((char *)&exp);
  ts_1 = (uint *)0x1;
  CompilerGLSL::to_enclosed_expression_abi_cxx11_(&local_210,&this->super_CompilerGLSL,obj,true);
  local_1b0 = BVar2;
  ::std::__cxx11::string::append((string *)&exp);
  bVar1 = op1_is_pointer;
  ::std::__cxx11::string::~string((string *)&local_210);
  __s1 = local_1a8;
  arg = op1;
  bVar7 = op1 != 0;
  iVar3 = strcmp(local_1a8,"atomic_compare_exchange_weak_explicit");
  id = op2;
  if ((bVar7 & bVar1) == 1) {
    if (iVar3 != 0) {
      __assert_fail("strcmp(op, \"atomic_compare_exchange_weak_explicit\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2534,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (op2 == 0) {
      __assert_fail("op2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2535,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (!has_mem_order_2) {
      __assert_fail("has_mem_order_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2536,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    ::std::__cxx11::string::append((char *)&exp);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_210,this,(ulong)result_id,1);
    ::std::__cxx11::string::append((string *)&exp);
    ::std::__cxx11::string::~string((string *)&local_210);
    ::std::__cxx11::string::append((char *)&exp);
    CompilerGLSL::to_expression_abi_cxx11_(&local_210,&this->super_CompilerGLSL,id,true);
    ::std::__cxx11::string::append((string *)&exp);
    ::std::__cxx11::string::~string((string *)&local_210);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    CompilerGLSL::emit_uninitialized_temporary_expression
              (&this->super_CompilerGLSL,local_1ac,result_id);
    CompilerGLSL::statement<char_const(&)[3]>(&this->super_CompilerGLSL,(char (*) [3])"do");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_210,this,(ulong)result_id,1);
    CompilerGLSL::to_expression_abi_cxx11_(&local_1d0,&this->super_CompilerGLSL,op1,true);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_210,(char (*) [4])0x395f16,&local_1d0,
               (char (*) [2])0x37e4df);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    ::std::__cxx11::string::~string((string *)&local_210);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_1d0,this,(ulong)result_id,1);
    CompilerGLSL::to_enclosed_expression_abi_cxx11_(&local_1a0,&this->super_CompilerGLSL,op1,true);
    join<char_const(&)[9],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string,char_const(&)[5],std::__cxx11::string,char_const(&)[2]>
              (&local_210,(spirv_cross *)"while (!",(char (*) [9])&exp,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" && ",
               (char (*) [5])&local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" == ",
               (char (*) [5])&local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,
               in_stack_fffffffffffffde8);
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL,&local_210);
    ::std::__cxx11::string::~string((string *)&local_210);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    ::std::__cxx11::string::~string((string *)&local_1d0);
  }
  else {
    if (iVar3 == 0) {
      __assert_fail("strcmp(op, \"atomic_compare_exchange_weak_explicit\") != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x254f,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (arg != 0) {
      if (op1_is_literal == false) {
        CompilerGLSL::bitcast_expression_abi_cxx11_
                  (&local_1d0,&this->super_CompilerGLSL,local_1b0,arg);
        ::std::operator+(&local_210,", ",&local_1d0);
        ::std::__cxx11::string::append((string *)&exp);
        ::std::__cxx11::string::~string((string *)&local_210);
        this_00 = &local_1d0;
      }
      else {
        join<char_const(&)[3],unsigned_int&>
                  (&local_210,(spirv_cross *)0x3964bc,(char (*) [3])&op1,ts_1);
        ::std::__cxx11::string::append((string *)&exp);
        this_00 = &local_210;
      }
      ::std::__cxx11::string::~string((string *)this_00);
    }
    if (id != 0) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_1d0,&this->super_CompilerGLSL,id,true);
      ::std::operator+(&local_210,", ",&local_1d0);
      ::std::__cxx11::string::append((string *)&exp);
      ::std::__cxx11::string::~string((string *)&local_210);
      ::std::__cxx11::string::~string((string *)&local_1d0);
    }
    ::std::__cxx11::string::string((string *)&local_1d0,", ",(allocator *)&local_1a0);
    ::std::operator+(&local_210,&local_1d0,"memory_order_relaxed");
    ::std::__cxx11::string::append((string *)&exp);
    ::std::__cxx11::string::~string((string *)&local_210);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    if (has_mem_order_2) {
      ::std::__cxx11::string::string((string *)&local_1d0,", ",(allocator *)&local_1a0);
      ::std::operator+(&local_210,&local_1d0,"memory_order_relaxed");
      ::std::__cxx11::string::append((string *)&exp);
      ::std::__cxx11::string::~string((string *)&local_210);
      ::std::__cxx11::string::~string((string *)&local_1d0);
    }
    ::std::__cxx11::string::append((char *)&exp);
    if (local_1b0 != *(BaseType *)&(pSVar4->super_IVariant).field_0xc) {
      CompilerGLSL::bitcast_expression(&local_210,&this->super_CompilerGLSL,pSVar4,local_1b0,&exp);
      ::std::__cxx11::string::operator=((string *)&exp,(string *)&local_210);
      ::std::__cxx11::string::~string((string *)&local_210);
    }
    iVar3 = strcmp(__s1,"atomic_store_explicit");
    if (iVar3 == 0) {
      CompilerGLSL::statement<std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,&exp,(char (*) [2])0x37e4df);
    }
    else {
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,local_1ac,result_id,&exp,false,false);
    }
  }
  Compiler::flush_all_atomic_capable_variables((Compiler *)this);
  SPIRType::~SPIRType(&remapped_type);
  ::std::__cxx11::string::~string((string *)&exp);
  return;
}

Assistant:

void CompilerMSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id, const char *op, Op opcode,
                                      uint32_t mem_order_1, uint32_t mem_order_2, bool has_mem_order_2, uint32_t obj, uint32_t op1,
                                      bool op1_is_pointer, bool op1_is_literal, uint32_t op2)
{
	string exp = string(op) + "(";

	auto &type = get_pointee_type(expression_type(obj));
	auto expected_type = type.basetype;
	if (opcode == OpAtomicUMax || opcode == OpAtomicUMin)
		expected_type = to_unsigned_basetype(type.width);
	else if (opcode == OpAtomicSMax || opcode == OpAtomicSMin)
		expected_type = to_signed_basetype(type.width);

	if (type.width == 64)
		SPIRV_CROSS_THROW("MSL currently does not support 64-bit atomics.");

	auto remapped_type = type;
	remapped_type.basetype = expected_type;

	exp += "(";
	auto *var = maybe_get_backing_variable(obj);
	if (!var)
		SPIRV_CROSS_THROW("No backing variable for atomic operation.");

	// Emulate texture2D atomic operations
	const auto &res_type = get<SPIRType>(var->basetype);
	if (res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image)
	{
		exp += "device";
	}
	else
	{
		exp += get_argument_address_space(*var);
	}

	exp += " atomic_";
	// For signed and unsigned min/max, we can signal this through the pointer type.
	// There is no other way, since C++ does not have explicit signage for atomics.
	exp += type_to_glsl(remapped_type);
	exp += "*)";

	exp += "&";
	exp += to_enclosed_expression(obj);

	bool is_atomic_compare_exchange_strong = op1_is_pointer && op1;

	if (is_atomic_compare_exchange_strong)
	{
		assert(strcmp(op, "atomic_compare_exchange_weak_explicit") == 0);
		assert(op2);
		assert(has_mem_order_2);
		exp += ", &";
		exp += to_name(result_id);
		exp += ", ";
		exp += to_expression(op2);
		exp += ", ";
		exp += get_memory_order(mem_order_1);
		exp += ", ";
		exp += get_memory_order(mem_order_2);
		exp += ")";

		// MSL only supports the weak atomic compare exchange, so emit a CAS loop here.
		// The MSL function returns false if the atomic write fails OR the comparison test fails,
		// so we must validate that it wasn't the comparison test that failed before continuing
		// the CAS loop, otherwise it will loop infinitely, with the comparison test always failing.
		// The function updates the comparitor value from the memory value, so the additional
		// comparison test evaluates the memory value against the expected value.
		emit_uninitialized_temporary_expression(result_type, result_id);
		statement("do");
		begin_scope();
		statement(to_name(result_id), " = ", to_expression(op1), ";");
		end_scope_decl(join("while (!", exp, " && ", to_name(result_id), " == ", to_enclosed_expression(op1), ")"));
	}
	else
	{
		assert(strcmp(op, "atomic_compare_exchange_weak_explicit") != 0);
		if (op1)
		{
			if (op1_is_literal)
				exp += join(", ", op1);
			else
				exp += ", " + bitcast_expression(expected_type, op1);
		}
		if (op2)
			exp += ", " + to_expression(op2);

		exp += string(", ") + get_memory_order(mem_order_1);
		if (has_mem_order_2)
			exp += string(", ") + get_memory_order(mem_order_2);

		exp += ")";

		if (expected_type != type.basetype)
			exp = bitcast_expression(type, expected_type, exp);

		if (strcmp(op, "atomic_store_explicit") != 0)
			emit_op(result_type, result_id, exp, false);
		else
			statement(exp, ";");
	}

	flush_all_atomic_capable_variables();
}